

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O2

string * __thiscall
glcts::PipelineStatisticsQueryUtilities::getStringForEnum_abi_cxx11_
          (string *__return_storage_ptr__,PipelineStatisticsQueryUtilities *this,GLenum value)

{
  allocator<char> local_11;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"[?]",&local_11);
  switch((int)this) {
  case 0x82ee:
    break;
  case 0x82ef:
    break;
  case 0x82f0:
    break;
  case 0x82f1:
    break;
  case 0x82f2:
    break;
  case 0x82f3:
    break;
  case 0x82f4:
    break;
  case 0x82f5:
    break;
  case 0x82f6:
    break;
  case 0x82f7:
    break;
  default:
    if ((int)this != 0x887f) {
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::assign((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string PipelineStatisticsQueryUtilities::getStringForEnum(glw::GLenum value)
{
	std::string result = "[?]";

	switch (value)
	{
	case GL_CLIPPING_INPUT_PRIMITIVES_ARB:
		result = "GL_CLIPPING_INPUT_PRIMITIVES_ARB";
		break;
	case GL_CLIPPING_OUTPUT_PRIMITIVES_ARB:
		result = "GL_CLIPPING_OUTPUT_PRIMITIVES_ARB";
		break;
	case GL_COMPUTE_SHADER_INVOCATIONS_ARB:
		result = "GL_COMPUTE_SHADER_INVOCATIONS_ARB";
		break;
	case GL_FRAGMENT_SHADER_INVOCATIONS_ARB:
		result = "GL_FRAGMENT_SHADER_INVOCATIONS_ARB";
		break;
	case GL_GEOMETRY_SHADER_INVOCATIONS:
		result = "GL_GEOMETRY_SHADER_INVOCATIONS";
		break;
	case GL_GEOMETRY_SHADER_PRIMITIVES_EMITTED_ARB:
		result = "GL_GEOMETRY_SHADER_PRIMITIVES_EMITTED_ARB";
		break;
	case GL_PRIMITIVES_SUBMITTED_ARB:
		result = "GL_PRIMITIVES_SUBMITTED_ARB";
		break;
	case GL_TESS_CONTROL_SHADER_PATCHES_ARB:
		result = "GL_TESS_CONTROL_SHADER_PATCHES_ARB";
		break;
	case GL_TESS_EVALUATION_SHADER_INVOCATIONS_ARB:
		result = "GL_TESS_EVALUATION_SHADER_INVOCATIONS_ARB";
		break;
	case GL_VERTEX_SHADER_INVOCATIONS_ARB:
		result = "GL_VERTEX_SHADER_INVOCATIONS_ARB";
		break;
	case GL_VERTICES_SUBMITTED_ARB:
		result = "GL_VERTICES_SUBMITTED_ARB";
		break;
	} /* switch (value) */

	return result;
}